

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_casts.cpp
# Opt level: O2

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::BindUnionToUnionCast
          (duckdb *this,BindCastInput *input,LogicalType *source,LogicalType *target)

{
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var1;
  bool bVar2;
  LogicalType *source_00;
  string *l1;
  idx_t iVar3;
  string *l2;
  LogicalType *target_00;
  reference pvVar4;
  ConversionException *this_00;
  idx_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong index_00;
  allocator local_129;
  LogicalType *local_128;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_120;
  BindCastInput *local_118;
  idx_t local_110;
  string message;
  vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> local_e8;
  vector<unsigned_long,_true> tag_map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  local_120._M_head_impl = (BoundCastData *)this;
  local_118 = input;
  local_110 = UnionType::GetMemberCount(source);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&tag_map,local_110,
             (allocator_type *)&message);
  local_e8.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index = 0;
  local_128 = source;
  do {
    if (index == local_110) {
      make_uniq<duckdb::UnionUnionBoundCastData,duckdb::vector<unsigned_long,true>&,duckdb::vector<duckdb::BoundCastInfo,true>,duckdb::LogicalType_const&>
                ((duckdb *)&message,&tag_map,(vector<duckdb::BoundCastInfo,_true> *)&local_e8,target
                );
      _Var1._M_head_impl = (BoundCastData *)local_120;
      *local_120._M_head_impl = (BoundCastData)message._M_dataplus._M_p;
      ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector
                (&local_e8);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&tag_map);
      return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
             (_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
             )_Var1._M_head_impl;
    }
    source_00 = UnionType::GetMemberType(source,index);
    l1 = UnionType::GetMemberName_abi_cxx11_(source,index);
    index_00 = 0;
    while( true ) {
      iVar3 = UnionType::GetMemberCount(target);
      if (iVar3 <= index_00) {
        ::std::__cxx11::string::string
                  (local_50,
                   "Type %s can\'t be cast as %s. The member \'%s\' is not present in target union",
                   &local_129);
        LogicalType::ToString_abi_cxx11_(&local_70,local_128);
        LogicalType::ToString_abi_cxx11_(&local_90,target);
        ::std::__cxx11::string::string((string *)&local_b0,(string *)l1);
        StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&message,(StringUtil *)local_50,&local_70,&local_90,&local_b0,in_R9);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string(local_50);
        this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
        ConversionException::ConversionException(this_00,&message);
        __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      l2 = UnionType::GetMemberName_abi_cxx11_(target,index_00);
      bVar2 = StringUtil::CIEquals(l1,l2);
      if (bVar2) break;
      index_00 = index_00 + 1;
    }
    target_00 = UnionType::GetMemberType(target,index_00);
    pvVar4 = vector<unsigned_long,_true>::get<true>(&tag_map,index);
    *pvVar4 = index_00;
    BindCastInput::GetCastFunction((BoundCastInfo *)&message,local_118,source_00,target_00);
    ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::
    emplace_back<duckdb::BoundCastInfo>(&local_e8,(BoundCastInfo *)&message);
    source = local_128;
    if (message.field_2._M_allocated_capacity != 0) {
      (**(code **)(*(long *)message.field_2._M_allocated_capacity + 8))();
    }
    index = index + 1;
  } while( true );
}

Assistant:

unique_ptr<BoundCastData> BindUnionToUnionCast(BindCastInput &input, const LogicalType &source,
                                               const LogicalType &target) {
	D_ASSERT(source.id() == LogicalTypeId::UNION);
	D_ASSERT(target.id() == LogicalTypeId::UNION);

	auto source_member_count = UnionType::GetMemberCount(source);

	auto tag_map = vector<idx_t>(source_member_count);
	auto member_casts = vector<BoundCastInfo>();

	for (idx_t source_idx = 0; source_idx < source_member_count; source_idx++) {
		auto &source_member_type = UnionType::GetMemberType(source, source_idx);
		auto &source_member_name = UnionType::GetMemberName(source, source_idx);

		bool found = false;
		for (idx_t target_idx = 0; target_idx < UnionType::GetMemberCount(target); target_idx++) {
			auto &target_member_name = UnionType::GetMemberName(target, target_idx);

			// found a matching member
			if (StringUtil::CIEquals(source_member_name, target_member_name)) {
				auto &target_member_type = UnionType::GetMemberType(target, target_idx);
				tag_map[source_idx] = target_idx;
				member_casts.push_back(input.GetCastFunction(source_member_type, target_member_type));
				found = true;
				break;
			}
		}
		if (!found) {
			// no matching member tag found in the target set
			auto message =
			    StringUtil::Format("Type %s can't be cast as %s. The member '%s' is not present in target union",
			                       source.ToString(), target.ToString(), source_member_name);
			throw ConversionException(message);
		}
	}

	return make_uniq<UnionUnionBoundCastData>(tag_map, std::move(member_casts), target);
}